

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

void pnga_access_ghost_element_ptr(Integer g_a,void *ptr,Integer *subscript,Integer *ld)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  C_Integer *pCVar4;
  global_array_t *pgVar5;
  Integer IVar6;
  Integer IVar7;
  long lVar8;
  ushort uVar9;
  long lVar10;
  long lVar11;
  C_Integer CVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int _index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer tmp_sub [7];
  
  lVar1 = g_a + 1000;
  lVar17 = 0;
  IVar6 = pnga_nodeid();
  pgVar5 = GA;
  uVar2 = GA[lVar1].ndim;
  lVar15 = (long)(short)uVar2;
  lVar8 = 0;
  if (0 < lVar15) {
    lVar8 = lVar15;
  }
  for (; lVar8 != lVar17; lVar17 = lVar17 + 1) {
    tmp_sub[lVar17] = subscript[lVar17] + -1;
  }
  lVar17 = lVar15 + -1;
  iVar14 = GA[lVar1].distr_type;
  if (iVar14 - 1U < 3) {
    lVar11 = (long)(int)IVar6 % GA[lVar1].num_blocks[0];
    _index[0] = (int)lVar11;
    lVar8 = 0;
    IVar7 = IVar6;
    while (lVar8 + 1 < lVar15) {
      IVar7 = (long)((int)IVar7 - (int)lVar11) / GA[g_a + 1000].num_blocks[lVar8];
      lVar11 = (long)(int)IVar7 % GA[g_a + 1000].num_blocks[lVar8 + 1];
      _index[lVar8 + 1] = (int)lVar11;
      lVar8 = lVar8 + 1;
    }
    lVar8 = 0;
    uVar9 = 0;
    if (0 < (short)uVar2) {
      uVar9 = uVar2;
    }
    for (; (ulong)uVar9 * 4 != lVar8; lVar8 = lVar8 + 4) {
      iVar14 = *(int *)((long)_index + lVar8);
      lVar11 = *(long *)((long)GA[g_a + 1000].block_dims + lVar8 * 2);
      *(long *)((long)_lo + lVar8 * 2) = lVar11 * iVar14 + 1;
      lVar11 = ((long)iVar14 + 1) * lVar11;
      lVar16 = *(long *)((long)GA[g_a + 1000].dims + lVar8 * 2);
      if (lVar16 <= lVar11) {
        lVar11 = lVar16;
      }
      *(long *)((long)_hi + lVar8 * 2) = lVar11;
    }
  }
  else if (iVar14 == 4) {
    lVar11 = (long)(int)IVar6 % GA[lVar1].num_blocks[0];
    _index[0] = (int)lVar11;
    IVar7 = IVar6;
    lVar8 = 0;
    while (lVar8 + 1 < lVar15) {
      IVar7 = (long)((int)IVar7 - (int)lVar11) / GA[g_a + 1000].num_blocks[lVar8];
      lVar11 = (long)(int)IVar7 % GA[g_a + 1000].num_blocks[lVar8 + 1];
      _index[lVar8 + 1] = (int)lVar11;
      lVar8 = lVar8 + 1;
    }
    lVar8 = 0;
    uVar9 = 0;
    if (0 < (short)uVar2) {
      uVar9 = uVar2;
    }
    iVar14 = 0;
    for (; (ulong)uVar9 * 4 != lVar8; lVar8 = lVar8 + 4) {
      pCVar4 = GA[lVar1].mapc;
      iVar3 = *(int *)((long)_index + lVar8);
      lVar16 = (long)iVar14 + (long)iVar3;
      *(C_Integer *)((long)_lo + lVar8 * 2) = pCVar4[lVar16];
      lVar11 = *(long *)((long)GA[lVar1].num_blocks + lVar8 * 2);
      if ((long)iVar3 < lVar11 + -1) {
        lVar16 = pCVar4[lVar16 + 1] + -1;
      }
      else {
        lVar16 = *(long *)((long)GA[lVar1].dims + lVar8 * 2);
      }
      *(long *)((long)_hi + lVar8 * 2) = lVar16;
      iVar14 = iVar14 + (int)lVar11;
    }
  }
  else if (iVar14 == 0) {
    if (GA[lVar1].num_rstrctd == 0) {
      lVar11 = 1;
      for (lVar16 = 0; lVar8 != lVar16; lVar16 = lVar16 + 1) {
        lVar11 = lVar11 * GA[g_a + 1000].nblock[lVar16];
      }
      if ((IVar6 < 0) || (lVar11 <= IVar6)) {
        for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
          _lo[lVar11] = 0;
          _hi[lVar11] = -1;
        }
      }
      else {
        lVar16 = 0;
        IVar7 = IVar6;
        for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
          lVar13 = (long)GA[g_a + 1000].nblock[lVar11];
          lVar10 = IVar7 % lVar13;
          pCVar4 = GA[lVar1].mapc;
          _lo[lVar11] = pCVar4[lVar10 + lVar16];
          if (lVar10 == lVar13 + -1) {
            CVar12 = GA[g_a + 1000].dims[lVar11];
          }
          else {
            CVar12 = pCVar4[lVar10 + lVar16 + 1] + -1;
          }
          lVar16 = lVar16 + lVar13;
          _hi[lVar11] = CVar12;
          IVar7 = IVar7 / lVar13;
        }
      }
    }
    else if (IVar6 < GA[lVar1].num_rstrctd) {
      lVar11 = 1;
      for (lVar16 = 0; lVar8 != lVar16; lVar16 = lVar16 + 1) {
        lVar11 = lVar11 * GA[g_a + 1000].nblock[lVar16];
      }
      if ((IVar6 < 0) || (lVar11 <= IVar6)) {
        for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
          _lo[lVar11] = 0;
          _hi[lVar11] = -1;
        }
      }
      else {
        lVar11 = 0;
        IVar7 = IVar6;
        for (lVar16 = 0; lVar8 != lVar16; lVar16 = lVar16 + 1) {
          lVar13 = (long)GA[g_a + 1000].nblock[lVar16];
          lVar10 = IVar7 % lVar13;
          pCVar4 = GA[lVar1].mapc;
          _lo[lVar16] = pCVar4[lVar10 + lVar11];
          if (lVar10 == lVar13 + -1) {
            CVar12 = GA[g_a + 1000].dims[lVar16];
          }
          else {
            CVar12 = pCVar4[lVar10 + lVar11 + 1] + -1;
          }
          lVar11 = lVar11 + lVar13;
          _hi[lVar16] = CVar12;
          IVar7 = IVar7 / lVar13;
        }
      }
    }
    else {
      lVar8 = 0;
      iVar14 = 0;
      if (0 < (short)uVar2) {
        iVar14 = (int)(short)uVar2;
      }
      for (; iVar14 != lVar8; lVar8 = lVar8 + 1) {
        _lo[lVar8] = 0;
        _hi[lVar8] = -1;
      }
    }
  }
  if (lVar17 == 0) {
    *ld = (_hi[0] - _lo[0]) + GA[lVar1].width[0] * 2 + 1;
  }
  lVar8 = 0;
  if (lVar17 < 1) {
    lVar17 = lVar8;
  }
  lVar11 = 1;
  for (lVar16 = 0; lVar17 != lVar16; lVar16 = lVar16 + 1) {
    lVar8 = lVar8 + tmp_sub[lVar16] * lVar11;
    lVar10 = (_hi[lVar16] - _lo[lVar16]) + pgVar5[g_a + 1000].width[lVar16] * 2 + 1;
    ld[lVar16] = lVar10;
    lVar11 = lVar11 * lVar10;
  }
  *(char **)ptr =
       pgVar5[lVar1].ptr[IVar6] +
       (long)pgVar5[lVar1].elemsize * (lVar11 * tmp_sub[lVar15 + -1] + lVar8);
  return;
}

Assistant:

void pnga_access_ghost_element_ptr(Integer g_a, void *ptr, 
                        Integer subscript[], Integer ld[]) 
{ 
  char *lptr; 
  Integer  handle = GA_OFFSET + g_a; 
  Integer i; 
  Integer tmp_sub[MAXDIM]; 
  Integer me = pnga_nodeid(); 
  /* Indices conform to Fortran convention. Shift them down 1 so that 
     gam_LocationWithGhosts works. */ 
  for (i=0; i<GA[handle].ndim; i++) tmp_sub[i] = subscript[i] - 1; 
  gam_LocationWithGhosts(me, handle, tmp_sub, &lptr, ld); 
 
  *(char**)ptr = lptr; 
}